

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

bool __thiscall
Inline::TryGetCallApplyCallbackTargetInlineeData
          (Inline *this,FunctionJITTimeInfo *inlinerData,Instr *callInstr,Instr *callApplyLdInstr,
          FunctionJITTimeInfo **inlineeData,Instr **callbackDefInstr,bool isCallInstanceFunction)

{
  char16 cVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  Instr *pIVar5;
  ProfiledInstr *pPVar6;
  JITTimeWorkItem *this_00;
  FunctionJITTimeInfo *pFVar7;
  JITTimeFunctionBody *this_01;
  char16 *pcVar8;
  char16 *pcVar9;
  wchar local_98 [4];
  char16 debugStringBuffer [42];
  ProfileId callSiteId;
  bool isCallInstanceFunction_local;
  Instr **callbackDefInstr_local;
  FunctionJITTimeInfo **inlineeData_local;
  Instr *callApplyLdInstr_local;
  Instr *callInstr_local;
  FunctionJITTimeInfo *inlinerData_local;
  Inline *this_local;
  
  debugStringBuffer[0x27]._1_1_ = isCallInstanceFunction;
  unique0x100001a7 = callbackDefInstr;
  if (isCallInstanceFunction) {
    pIVar5 = TryGetCallbackDefInstrForCallInstanceFunction(this,callInstr);
    *stack0xffffffffffffffc0 = pIVar5;
  }
  else {
    pIVar5 = TryGetCallbackDefInstrForCallApplyTarget(this,callApplyLdInstr);
    *stack0xffffffffffffffc0 = pIVar5;
  }
  if (*stack0xffffffffffffffc0 != (Instr *)0x0) {
    pPVar6 = IR::Instr::AsProfiledInstr(*stack0xffffffffffffffc0);
    debugStringBuffer[0x26] = (pPVar6->u).field_3.fldInfoData.f1;
    this_00 = Func::GetWorkItem((*stack0xffffffffffffffc0)->m_func);
    pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this_00);
    pFVar7 = FunctionJITTimeInfo::GetCallbackInlinee(pFVar7,debugStringBuffer[0x26]);
    *inlineeData = pFVar7;
    uVar3 = Func::GetSourceContextId(this->topFunc);
    uVar4 = Func::GetLocalFunctionId(this->topFunc);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlineCallbacksPhase,uVar3,uVar4);
    if (!bVar2) {
      uVar3 = Func::GetSourceContextId(this->topFunc);
      uVar4 = Func::GetLocalFunctionId(this->topFunc);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,InlineCallbacksPhase,uVar3,uVar4);
      if (!bVar2) {
        return true;
      }
    }
    cVar1 = debugStringBuffer[0x26];
    this_01 = FunctionJITTimeInfo::GetBody(inlinerData);
    pcVar8 = JITTimeFunctionBody::GetDisplayName(this_01);
    pcVar9 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_98);
    Output::Print(L"INLINING : Found callback def instr for call/apply target callback at\tCallSite: %d\tCaller: %s (%s)\n"
                  ,(ulong)(ushort)cVar1,pcVar8,pcVar9);
    Output::Flush();
    return true;
  }
  return false;
}

Assistant:

bool
Inline::TryGetCallApplyCallbackTargetInlineeData(
    const FunctionJITTimeInfo* inlinerData,
    IR::Instr * callInstr,
    IR::Instr * callApplyLdInstr,
    const FunctionJITTimeInfo ** inlineeData,
    IR::Instr ** callbackDefInstr,
    bool isCallInstanceFunction)
{
    // Try to find a callback def instr for the method.
    if (isCallInstanceFunction)
    {
        *callbackDefInstr = TryGetCallbackDefInstrForCallInstanceFunction(callInstr);
    }
    else
    {
        *callbackDefInstr = TryGetCallbackDefInstrForCallApplyTarget(callApplyLdInstr);
    }

    if (*callbackDefInstr == nullptr)
    {
        return false;
    }

    Js::ProfileId callSiteId = static_cast<Js::ProfileId>((*callbackDefInstr)->AsProfiledInstr()->u.profileId);
    *inlineeData = (*callbackDefInstr)->m_func->GetWorkItem()->GetJITTimeInfo()->GetCallbackInlinee(callSiteId);

#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    INLINE_CALLBACKS_TRACE(_u("INLINING : Found callback def instr for call/apply target callback at\tCallSite: %d\tCaller: %s (%s)\n"),
        callSiteId, inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
#endif

    return true;
}